

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperSuper.c
# Opt level: O0

char * Map_LibraryReadFormulaStep(char *pFormula,char **pStrings,int *pnStrings)

{
  char *pcVar1;
  bool bVar2;
  int local_50;
  int local_4c;
  int CountPars;
  int nStrings;
  char *pCur;
  char *pPar2;
  char *pPar1;
  char *pName;
  int *pnStrings_local;
  char **pStrings_local;
  char *pFormula_local;
  
  pPar1 = pFormula;
  while( true ) {
    bVar2 = false;
    if (*pPar1 != '\0') {
      bVar2 = *pPar1 == ' ';
    }
    if (!bVar2) break;
    pPar1 = pPar1 + 1;
  }
  if (*pPar1 == '\0') {
    __assert_fail("*pName",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSuper.c"
                  ,0x107,"char *Map_LibraryReadFormulaStep(char *, char **, int *)");
  }
  pPar2 = pPar1;
  while( true ) {
    bVar2 = false;
    if (*pPar2 != '\0') {
      bVar2 = *pPar2 != '(';
    }
    if (!bVar2) break;
    pPar2 = pPar2 + 1;
  }
  if (*pPar2 == '\0') {
    *pnStrings = 0;
  }
  else {
    if (*pPar2 != '(') {
      __assert_fail("*pPar1 == \'(\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSuper.c"
                    ,0x110,"char *Map_LibraryReadFormulaStep(char *, char **, int *)");
    }
    *pPar2 = '\0';
    local_50 = 1;
    pcVar1 = pPar2;
    while (pCur = pcVar1 + 1, *pCur != '\0' && local_50 != 0) {
      pcVar1 = pCur;
      if (*pCur == '(') {
        local_50 = local_50 + 1;
      }
      else if (*pCur == ')') {
        local_50 = local_50 + -1;
      }
    }
    if (local_50 != 0) {
      __assert_fail("CountPars == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSuper.c"
                    ,0x119,"char *Map_LibraryReadFormulaStep(char *, char **, int *)");
    }
    if (*pcVar1 != ')') {
      __assert_fail("*pPar2 == \')\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSuper.c"
                    ,0x11b,"char *Map_LibraryReadFormulaStep(char *, char **, int *)");
    }
    *pcVar1 = '\0';
    local_4c = 0;
    while( true ) {
      _CountPars = pPar2 + 1;
      pStrings[local_4c] = _CountPars;
      local_50 = 0;
      while( true ) {
        bVar2 = false;
        if ((*_CountPars != '\0') && (bVar2 = true, local_50 == 0)) {
          bVar2 = *_CountPars != ',';
        }
        if (!bVar2) break;
        if (*_CountPars == '(') {
          local_50 = local_50 + 1;
        }
        else if (*_CountPars == ')') {
          local_50 = local_50 + -1;
        }
        _CountPars = _CountPars + 1;
      }
      if (*_CountPars == '\0') break;
      if (*_CountPars != ',') {
        __assert_fail("*pCur == \',\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSuper.c"
                      ,300,"char *Map_LibraryReadFormulaStep(char *, char **, int *)");
      }
      *_CountPars = '\0';
      local_4c = local_4c + 1;
      pPar2 = _CountPars;
    }
    *pnStrings = local_4c + 1;
  }
  return pPar1;
}

Assistant:

char * Map_LibraryReadFormulaStep( char * pFormula, char * pStrings[], int * pnStrings )
{
    char * pName, * pPar1, * pPar2, * pCur;
    int nStrings, CountPars;

    // skip leading spaces
    for ( pName = pFormula; *pName && *pName == ' '; pName++ );
    assert( *pName );
    // find the first opening parenthesis
    for ( pPar1 = pName; *pPar1 && *pPar1 != '('; pPar1++ );
    if ( *pPar1 == 0 )
    {
        *pnStrings = 0;
        return pName;
    }
    // overwrite it with space
    assert( *pPar1 == '(' );
    *pPar1 = 0;
    // find the corresponding closing parenthesis
    for ( CountPars = 1, pPar2 = pPar1 + 1; *pPar2 && CountPars; pPar2++ )
        if ( *pPar2 == '(' )
            CountPars++;
        else if ( *pPar2 == ')' )
            CountPars--;
    pPar2--;
    assert( CountPars == 0 );
    // overwrite it with space
    assert( *pPar2 == ')' );
    *pPar2 = 0;
    // save the intervals between the commas
    nStrings = 0;
    pCur = pPar1 + 1;
    while ( 1 )
    {
        // save the current string
        pStrings[ nStrings++ ] = pCur;
        // find the beginning of the next string
        for ( CountPars = 0; *pCur && (CountPars || *pCur != ','); pCur++ )
            if ( *pCur == '(' )
                CountPars++;
            else if ( *pCur == ')' )
                CountPars--;
        if ( *pCur == 0 )
            break;
        assert( *pCur == ',' );
        *pCur = 0;
        pCur++;
    }
    // save the results and return
    *pnStrings = nStrings;
    return pName;
}